

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O0

bool is_sort(int *arr,int len,Order type)

{
  code *pcVar1;
  int local_28;
  int local_24;
  int i_1;
  int i;
  Order type_local;
  int len_local;
  int *arr_local;
  
  if (type == ABC) {
    for (local_28 = 1; local_28 < len; local_28 = local_28 + 1) {
      if (arr[local_28] < arr[local_28 + -1]) {
        return false;
      }
    }
  }
  else {
    if (type != DESC) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    for (local_24 = 1; local_24 < len; local_24 = local_24 + 1) {
      if (arr[local_24 + -1] < arr[local_24]) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool is_sort(int* arr, int len, Order type){
    switch (type) {
        case DESC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] < arr[i]) {
                    return false;
                }
            }
            return true;
        case ABC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] > arr[i]) {
                    return false;
                }
            }
            return true;
    }
}